

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O3

void __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::rescalePartials
          (BeagleCPU4StateImpl<float,_1,_0> *this,float *destP,float *scaleFactors,
          float *cumulativeScaleFactors,int fillWithOnes)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  undefined8 uVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int iVar15;
  float fVar16;
  double dVar17;
  undefined1 auVar18 [16];
  float fVar19;
  long lVar14;
  
  if (0 < (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount) {
    lVar3 = (this->super_BeagleCPUImpl<float,_1,_0>).kFlags;
    lVar11 = 0;
    iVar15 = 0;
    do {
      fVar16 = 1.0;
      iVar9 = (this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
      if (0 < iVar9) {
        auVar18 = ZEXT816(0);
        iVar10 = iVar9;
        iVar12 = iVar15;
        do {
          lVar13 = (long)iVar12;
          auVar18 = vmaxss_avx(ZEXT416((uint)destP[iVar12]),auVar18);
          auVar18 = vmaxss_avx(ZEXT416((uint)destP[(long)iVar12 + 1]),auVar18);
          lVar14 = (long)iVar12;
          iVar12 = iVar12 + (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount * 4;
          iVar10 = iVar10 + -1;
          auVar18 = vmaxss_avx(ZEXT416((uint)destP[lVar13 + 2]),auVar18);
          auVar18 = vmaxss_avx(ZEXT416((uint)destP[lVar14 + 3]),auVar18);
        } while (iVar10 != 0);
        uVar4 = vcmpss_avx512f(auVar18,ZEXT416(0),0);
        bVar5 = (bool)((byte)uVar4 & 1);
        fVar16 = (float)((uint)bVar5 * 0x3f800000 + (uint)!bVar5 * auVar18._0_4_);
        if (0 < iVar9) {
          iVar10 = (this->super_BeagleCPUImpl<float,_1,_0>).kPaddedPatternCount;
          fVar19 = 1.0 / fVar16;
          iVar12 = iVar15;
          do {
            pfVar1 = destP + iVar12;
            fVar6 = pfVar1[1];
            fVar7 = pfVar1[2];
            fVar8 = pfVar1[3];
            pfVar2 = destP + iVar12;
            *pfVar2 = fVar19 * *pfVar1;
            pfVar2[1] = fVar19 * fVar6;
            pfVar2[2] = fVar19 * fVar7;
            pfVar2[3] = fVar19 * fVar8;
            iVar12 = iVar12 + iVar10 * 4;
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
      }
      if (((uint)lVar3 >> 10 & 1) == 0) {
        scaleFactors[lVar11] = fVar16;
        if (cumulativeScaleFactors != (float *)0x0) {
          dVar17 = log((double)fVar16);
          fVar16 = (float)(dVar17 + (double)cumulativeScaleFactors[lVar11]);
LAB_0013a2e6:
          cumulativeScaleFactors[lVar11] = fVar16;
        }
      }
      else {
        dVar17 = log((double)fVar16);
        scaleFactors[lVar11] = (float)dVar17;
        if (cumulativeScaleFactors != (float *)0x0) {
          fVar16 = (float)dVar17 + cumulativeScaleFactors[lVar11];
          goto LAB_0013a2e6;
        }
      }
      lVar11 = lVar11 + 1;
      iVar15 = iVar15 + 4;
    } while (lVar11 < (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::rescalePartials(REALTYPE* destP,
		REALTYPE* scaleFactors,
		REALTYPE* cumulativeScaleFactors,
        const int  fillWithOnes) {

	bool useLogScalars = kFlags & BEAGLE_FLAG_SCALERS_LOG;

    for (int k = 0; k < kPatternCount; k++) {
    	REALTYPE max = 0;
        const int patternOffset = k * 4;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;

#ifdef BEAGLE_TEST_OPTIMIZATION
            REALTYPE max01 = FAST_MAX(destP[offset + 0], destP[offset + 1]);
            REALTYPE max23 = FAST_MAX(destP[offset + 2], destP[offset + 3]);
            max = FAST_MAX(max, max01);
            max = FAST_MAX(max, max23);
#else
			#pragma unroll
            for (int i = 0; i < 4; i++) {
                if(destP[offset] > max)
                    max = destP[offset];
                offset++;
            }
#endif
        }

        if (max == 0)
            max = REALTYPE(1.0);

        REALTYPE oneOverMax = REALTYPE(1.0) / max;
        for (int l = 0; l < kCategoryCount; l++) {
            int offset = l * kPaddedPatternCount * 4 + patternOffset;
			#pragma unroll
            for (int i = 0; i < 4; i++)
                destP[offset++] *= oneOverMax;
        }

        if (useLogScalars) {
            REALTYPE logMax = log(max);
            scaleFactors[k] = logMax;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += logMax;
        } else {
            scaleFactors[k] = max;
            if( cumulativeScaleFactors != NULL )
                cumulativeScaleFactors[k] += log(max);
        }
    }
}